

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::Temperature> metaf::Temperature::fromRemarkString(string *s)

{
  _Optional_base<metaf::Temperature,_true,_true> _Var1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  _Optional_payload_base<unsigned_int> this;
  float *pfVar5;
  ulong in_RDI;
  size_t unaff_retaddr;
  string *in_stack_00000008;
  int tValueSigned;
  optional<unsigned_int> t;
  optional<metaf::Temperature> error;
  Temperature *in_stack_ffffffffffffffb8;
  optional<metaf::Temperature> *in_stack_ffffffffffffffc0;
  float value;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_10;
  size_t in_stack_fffffffffffffff8;
  
  std::optional<metaf::Temperature>::optional((optional<metaf::Temperature> *)0x24c333);
  lVar3 = std::__cxx11::string::length();
  if (lVar3 == 4) {
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI);
    if (*pcVar4 != '0') {
      pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI);
      if (*pcVar4 != '1') {
        local_10 = local_28;
        in_stack_fffffffffffffff8 = local_20;
        goto LAB_0024c439;
      }
    }
    this = (_Optional_payload_base<unsigned_int>)
           strToUint(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8);
    bVar2 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x24c3c4);
    if (bVar2) {
      pfVar5 = (float *)std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x24c3e8);
      value = *pfVar5;
      pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI);
      if (*pcVar4 == '1') {
        value = (float)-(int)value;
      }
      Temperature((Temperature *)this,value);
      std::optional<metaf::Temperature>::optional<metaf::Temperature,_true>
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    else {
      local_10 = local_28;
      in_stack_fffffffffffffff8 = local_20;
    }
  }
  else {
    local_10 = local_28;
    in_stack_fffffffffffffff8 = local_20;
  }
LAB_0024c439:
  _Var1._M_payload.super__Optional_payload_base<metaf::Temperature>._8_8_ =
       in_stack_fffffffffffffff8;
  _Var1._M_payload.super__Optional_payload_base<metaf::Temperature>._M_payload._M_value.tempValue.
  super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
       (optional<int>)(optional<int>)local_10;
  return (_Optional_base<metaf::Temperature,_true,_true>)
         (_Optional_base<metaf::Temperature,_true,_true>)
         _Var1._M_payload.super__Optional_payload_base<metaf::Temperature>;
}

Assistant:

std::optional<Temperature> Temperature::fromRemarkString(const std::string & s) {
	//static const std::regex ("([01])(\\d\\d\\d)");
	std::optional<Temperature> error;
	if (s.length() != 4) return error;
	if (s[0] != '0' && s[0] != '1') return error;
	const auto t = strToUint(s, 1, 3);
	if (!t.has_value()) return error;
	int tValueSigned = int(*t);
	if (s[0] == '1') tValueSigned = -tValueSigned;
	return Temperature(tValueSigned / 10.0f);
}